

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O2

void api_suite::api_ctor_default(void)

{
  long local_78;
  undefined4 local_6c;
  map_array<int,_int,_4UL,_std::less<int>_> array;
  
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.member
  .tail = (pointer)&array.super_map_view<int,_int,_4UL,_std::less<int>_>;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].second = 0;
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.member
  .head = (pointer)&array;
  local_78 = 0;
  local_6c = 0;
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail =
       array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
       member.head;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x29,"void api_suite::api_ctor_default()",&local_78,&local_6c);
  local_78 = (long)array.super_map_view<int,_int,_4UL,_std::less<int>_>.
                   super_span<vista::pair<int,_int>,_4UL>.member.tail -
             (long)array.super_map_view<int,_int,_4UL,_std::less<int>_>.
                   super_span<vista::pair<int,_int>,_4UL>.member.head >> 3;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x2a,"void api_suite::api_ctor_default()",&local_78,&local_6c);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}